

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StopScanThreadRPLIDARx(RPLIDAR *pRPLIDAR)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = RPLIDARCS;
  lVar1 = 0;
  do {
    if (*(RPLIDAR **)((long)addrsRPLIDAR + lVar1 * 2) == pRPLIDAR) {
      *(undefined4 *)((long)bExitScanRPLIDAR + lVar1) = 1;
      WaitForThread(*(THREAD_IDENTIFIER *)((long)RPLIDARScanThreadId + lVar1 * 2));
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resRPLIDAR + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopScanThreadRPLIDARx(RPLIDAR* pRPLIDAR)
{
	int id = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitScanRPLIDAR[id] = TRUE;
	WaitForThread(RPLIDARScanThreadId[id]);
	DeleteCriticalSection(&RPLIDARCS[id]);
	resRPLIDAR[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}